

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Dim dxil_spv::image_dimension_from_resource_kind(ResourceKind kind)

{
  Dim local_c;
  ResourceKind kind_local;
  
  switch(kind) {
  case Texture1D:
  case Texture1DArray:
    local_c = Dim1D;
    break;
  case Texture2D:
  case Texture2DMS:
  case Texture2DArray:
  case Texture2DMSArray:
  case FeedbackTexture2D:
  case FeedbackTexture2DArray:
    local_c = Dim2D;
    break;
  case Texture3D:
    local_c = Dim3D;
    break;
  case TextureCube:
  case TextureCubeArray:
    local_c = DimCube;
    break;
  case TypedBuffer:
  case RawBuffer:
  case StructuredBuffer:
    local_c = DimBuffer;
    break;
  default:
    local_c = DimMax;
  }
  return local_c;
}

Assistant:

static spv::Dim image_dimension_from_resource_kind(DXIL::ResourceKind kind)
{
	switch (kind)
	{
	case DXIL::ResourceKind::Texture1D:
	case DXIL::ResourceKind::Texture1DArray:
		return spv::Dim1D;
	case DXIL::ResourceKind::Texture2D:
	case DXIL::ResourceKind::Texture2DMS:
	case DXIL::ResourceKind::Texture2DArray:
	case DXIL::ResourceKind::Texture2DMSArray:
	case DXIL::ResourceKind::FeedbackTexture2D:
	case DXIL::ResourceKind::FeedbackTexture2DArray:
		return spv::Dim2D;
	case DXIL::ResourceKind::Texture3D:
		return spv::Dim3D;
	case DXIL::ResourceKind::TextureCube:
	case DXIL::ResourceKind::TextureCubeArray:
		return spv::DimCube;

	case DXIL::ResourceKind::TypedBuffer:
	case DXIL::ResourceKind::StructuredBuffer:
	case DXIL::ResourceKind::RawBuffer:
		return spv::DimBuffer;

	default:
		return spv::DimMax;
	}
}